

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O2

void NULLCCanvas::CanvasDrawLine(double x0,double y0,double x1,double y1,Canvas *ptr)

{
  if (ptr == (Canvas *)0x0) {
    nullcThrowError("ERROR: Canvas object is nullptr");
    return;
  }
  if (ptr->aaEnabled == true) {
    CanvasDrawLineAA(x0,y0,x1,y1,ptr);
    return;
  }
  CanvasDrawLineNoAA((int)x0,(int)y0,(int)x1,(int)y1,ptr);
  return;
}

Assistant:

void CanvasDrawLine(double x0, double y0, double x1, double y1, Canvas* ptr)
	{
		if(!ptr)
		{
			nullcThrowError("ERROR: Canvas object is nullptr");
			return;
		}
		if(ptr->aaEnabled)
			CanvasDrawLineAA(x0, y0, x1, y1, ptr);
		else
			CanvasDrawLineNoAA(int(x0), int(y0), int(x1), int(y1), ptr);
	}